

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O0

bool __thiscall BamTools::FilterTool::FilterToolPrivate::SetupFilters(FilterToolPrivate *this)

{
  long in_RDI;
  FilterToolPrivate *in_stack_00000010;
  FilterToolPrivate *in_stack_000005e8;
  FilterToolPrivate *in_stack_00000780;
  undefined1 local_1;
  
  InitProperties(in_stack_00000010);
  if ((*(byte *)(*(long *)(in_RDI + 0x18) + 4) & 1) == 0) {
    local_1 = ParseCommandLine(in_stack_00000780);
  }
  else {
    local_1 = ParseScript(in_stack_000005e8);
  }
  return local_1;
}

Assistant:

bool FilterTool::FilterToolPrivate::SetupFilters()
{

    // set up filter engine with supported properties
    InitProperties();

    // parse script for filter rules, if given
    if (m_settings->HasScript) return ParseScript();

    // otherwise check command line for filters
    else
        return ParseCommandLine();
}